

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *tree,CordRep *rep)

{
  byte bVar1;
  size_t delta;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  CordRepBtree *edge;
  CordRepBtree *pCVar5;
  size_t sVar6;
  Action AVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  CordRepBtree *unaff_R15;
  OpResult OVar12;
  OpResult result;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> ops;
  uint local_98 [2];
  undefined8 local_90 [12];
  
  bVar1 = (tree->super_CordRep).storage[0];
  uVar10 = (ulong)bVar1;
  delta = rep->length;
  uVar3 = 0;
  pCVar5 = tree;
  while ((uVar4 = uVar10, uVar10 != uVar3 &&
         (uVar4 = uVar3, (pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2)
         )) {
    local_90[uVar3] = pCVar5;
    uVar3 = uVar3 + 1;
    pCVar5 = *(CordRepBtree **)
              ((pCVar5->super_CordRep).storage + (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5)
    ;
    if ((pCVar5->super_CordRep).tag != '\x03') goto LAB_00253239;
  }
  local_98[0] = (uint)((pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) +
                (int)uVar4;
  uVar8 = uVar4 & 0xffffffff;
  uVar9 = (uint)bVar1;
  uVar3 = uVar4 & 0xffffffff;
  if ((int)uVar4 <= (int)uVar9) {
    uVar3 = (ulong)uVar9;
  }
  do {
    if (uVar3 == uVar8) {
      sVar6 = delta;
      OVar12 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         (pCVar5,(int)uVar9 < (int)local_98[0],rep,delta);
      if (uVar10 != 0) {
        do {
          edge = OVar12.tree;
          uVar9 = (uint)uVar10;
          uVar11 = uVar9 - 1;
          sVar6 = (size_t)(int)uVar9;
          pCVar5 = (CordRepBtree *)local_90[sVar6 - 1];
          AVar7 = OVar12.action;
          if (AVar7 == kSelf) {
            (pCVar5->super_CordRep).length = (pCVar5->super_CordRep).length + delta;
            bVar2 = false;
            if (uVar9 < 2) {
              uVar10 = (ulong)uVar11;
              OVar12._8_8_ = 0;
              OVar12.tree = edge;
            }
            else {
              sVar6 = (ulong)uVar11 + 1;
              do {
                pCVar5 = *(CordRepBtree **)(local_98 + sVar6 * 2 + -2);
                (pCVar5->super_CordRep).length = (pCVar5->super_CordRep).length + delta;
                sVar6 = sVar6 - 1;
                uVar11 = uVar11 - 1;
              } while (1 < (long)sVar6);
              bVar2 = false;
              uVar10 = (ulong)uVar11;
              OVar12._8_8_ = 0;
              OVar12.tree = edge;
            }
          }
          else {
            bVar2 = true;
            sVar6 = (size_t)local_98[0];
            if (AVar7 == kCopied) {
              sVar6 = delta;
              OVar12 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                 (pCVar5,(int)uVar9 <= (int)local_98[0],&edge->super_CordRep,delta);
            }
            else if (AVar7 == kPopped) {
              sVar6 = delta;
              OVar12 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                 (pCVar5,(int)uVar9 <= (int)local_98[0],&edge->super_CordRep,delta);
            }
            uVar10 = (ulong)uVar11;
            pCVar5 = unaff_R15;
          }
          if (!bVar2) {
            return pCVar5;
          }
          unaff_R15 = pCVar5;
        } while (0 < (int)uVar10);
      }
      result.tree = OVar12._8_8_;
      result._8_8_ = sVar6;
      pCVar5 = anon_unknown_0::
               StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::
               Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)tree,OVar12.tree,result);
      return pCVar5;
    }
    local_90[uVar8] = pCVar5;
    uVar8 = uVar8 + 1;
    pCVar5 = *(CordRepBtree **)
              ((pCVar5->super_CordRep).storage + (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5)
    ;
  } while ((pCVar5->super_CordRep).tag == '\x03');
LAB_00253239:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddCordRep(CordRepBtree* tree, CordRep* rep) {
  const int depth = tree->height();
  const size_t length = rep->length;
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);
  const OpResult result =
      leaf->AddEdge<edge_type>(ops.owned(depth), rep, length);
  return ops.Unwind(tree, depth, length, result);
}